

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O2

bool __thiscall libcellml::XmlNode::hasNamespaceDefinition(XmlNode *this,string *uri)

{
  __type _Var1;
  bool bVar2;
  xmlNs *next;
  xmlNs *pxVar3;
  string href;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pxVar3 = this->mPimpl->mXmlNodePtr->nsDef;
  if (pxVar3 == (xmlNs *)0x0) {
    bVar2 = false;
  }
  else {
    do {
      bVar2 = pxVar3 != (xmlNs *)0x0;
      if (pxVar3 == (xmlNs *)0x0) {
        return bVar2;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)pxVar3->href,&local_51);
      _Var1 = std::operator==(&local_50,uri);
      if (!_Var1) {
        pxVar3 = pxVar3->next;
      }
      std::__cxx11::string::~string((string *)&local_50);
    } while (!_Var1);
  }
  return bVar2;
}

Assistant:

bool XmlNode::hasNamespaceDefinition(const std::string &uri)
{
    if (mPimpl->mXmlNodePtr->nsDef != nullptr) {
        auto next = mPimpl->mXmlNodePtr->nsDef;
        while (next != nullptr) {
            // If you have a namespace, the href cannot be empty.
            std::string href = std::string(reinterpret_cast<const char *>(next->href));
            if (href == uri) {
                return true;
            }
            next = next->next;
        }
    }
    return false;
}